

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.cpp
# Opt level: O0

void __thiscall setup::task_entry::load(task_entry *this,istream *is,info *i)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  flag_type fVar4;
  int_adapter<unsigned_int> *in_RDX;
  istream *in_RSI;
  string *in_RDI;
  stored_flag_reader<flags<setup::task_entry::flags_Enum_,_5UL>_> flagreader;
  istream *in_stack_fffffffffffffee8;
  istream *in_stack_fffffffffffffef0;
  istream *this_00;
  encoded_string local_a8;
  encoded_string local_90;
  encoded_string local_78;
  encoded_string local_60;
  encoded_string local_48;
  encoded_string local_30;
  int_adapter<unsigned_int> *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  util::encoded_string::encoded_string(&local_30,in_RDI,in_RDX[6].value_);
  util::operator>>(in_stack_fffffffffffffef0,(encoded_string *)in_stack_fffffffffffffee8);
  this_00 = local_10;
  util::encoded_string::encoded_string(&local_48,in_RDI + 1,local_18[6].value_);
  util::operator>>(in_stack_fffffffffffffef0,(encoded_string *)in_stack_fffffffffffffee8);
  util::encoded_string::encoded_string(&local_60,in_RDI + 2,local_18[6].value_);
  util::operator>>(in_stack_fffffffffffffef0,(encoded_string *)in_stack_fffffffffffffee8);
  util::encoded_string::encoded_string(&local_78,in_RDI + 3,local_18[6].value_);
  util::operator>>(in_stack_fffffffffffffef0,(encoded_string *)in_stack_fffffffffffffee8);
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x4000100) {
    std::__cxx11::string::clear();
  }
  else {
    in_stack_fffffffffffffef0 = local_10;
    util::encoded_string::encoded_string(&local_90,in_RDI + 4,local_18[6].value_);
    util::operator>>(in_stack_fffffffffffffef0,(encoded_string *)in_stack_fffffffffffffee8);
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if ((0x3ffffff < uVar2) ||
     ((bVar1 = setup::version::is_isx((version *)in_stack_fffffffffffffef0), bVar1 &&
      (uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), 0x10317ff < uVar2))
     )) {
    util::encoded_string::encoded_string(&local_a8,in_RDI + 5,local_18[6].value_);
    util::operator>>(in_stack_fffffffffffffef0,(encoded_string *)local_10);
    in_stack_fffffffffffffee8 = local_10;
  }
  else {
    std::__cxx11::string::clear();
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if ((0x3ffffff < uVar2) ||
     ((bVar1 = setup::version::is_isx((version *)in_stack_fffffffffffffef0), bVar1 &&
      (uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), 0x30002ff < uVar2))
     )) {
    iVar3 = util::load<int>((istream *)0x189e4e);
    *(int *)(in_RDI + 6) = iVar3;
  }
  else {
    *(undefined4 *)(in_RDI + 6) = 0;
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if ((0x3ffffff < uVar2) ||
     ((bVar1 = setup::version::is_isx((version *)in_stack_fffffffffffffef0), bVar1 &&
      (uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), 0x30003ff < uVar2))
     )) {
    bVar1 = util::load_bool((istream *)0x189eb4);
    in_RDI[6].field_0x4 = bVar1;
  }
  else {
    in_RDI[6].field_0x4 = 1;
  }
  windows_version_range::load
            ((windows_version_range *)this_00,in_RSI,(version *)in_stack_fffffffffffffef0);
  stored_flag_reader<flags<setup::data_entry::flags_Enum_,_12UL>_>::stored_flag_reader
            ((stored_flag_reader<flags<setup::data_entry::flags_Enum_,_12UL>_> *)
             in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0x189f0a);
  stored_flag_reader<setup::task_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::task_entry::flags_Enum_> *)in_stack_fffffffffffffef0,
             (enum_type)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  stored_flag_reader<setup::task_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::task_entry::flags_Enum_> *)in_stack_fffffffffffffef0,
             (enum_type)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x20004ff < uVar2) {
    stored_flag_reader<setup::task_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::task_entry::flags_Enum_> *)in_stack_fffffffffffffef0,
               (enum_type)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x20005ff < uVar2) {
    stored_flag_reader<setup::task_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::task_entry::flags_Enum_> *)in_stack_fffffffffffffef0,
               (enum_type)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (0x40202ff < uVar2) {
    stored_flag_reader<setup::task_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::task_entry::flags_Enum_> *)in_stack_fffffffffffffef0,
               (enum_type)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  }
  fVar4 = stored_flag_reader<setup::data_entry::flags_Enum_>::finalize
                    ((stored_flag_reader<setup::data_entry::flags_Enum_> *)in_stack_fffffffffffffee8
                    );
  in_RDI[8]._M_string_length = (size_type)fVar4._flags.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void task_entry::load(std::istream & is, const info & i) {
	
	is >> util::encoded_string(name, i.codepage);
	is >> util::encoded_string(description, i.codepage);
	is >> util::encoded_string(group_description, i.codepage);
	is >> util::encoded_string(components, i.codepage);
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::encoded_string(languages, i.codepage);
	} else {
		languages.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 24))) {
		is >> util::encoded_string(check, i.codepage);
	} else {
		check.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(3, 0, 3))) {
		level = util::load<boost::int32_t>(is);
	} else {
		level = 0;
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(3, 0, 4))) {
		used = util::load_bool(is);
	} else {
		used = true;
	}
	
	winver.load(is, i.version);
	
	stored_flag_reader<flags> flagreader(is);
	
	flagreader.add(Exclusive);
	flagreader.add(Unchecked);
	if(i.version >= INNO_VERSION(2, 0, 5)) {
		flagreader.add(Restart);
	}
	if(i.version >= INNO_VERSION(2, 0, 6)) {
		flagreader.add(CheckedOnce);
	}
	if(i.version >= INNO_VERSION(4, 2, 3)) {
		flagreader.add(DontInheritCheck);
	}
	
	options = flagreader.finalize();
}